

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void mcalcdistress(void)

{
  uchar uVar1;
  int iVar2;
  monst *local_10;
  monst *mtmp;
  
  local_10 = level->monlist;
  do {
    if (local_10 == (monst *)0x0) {
      return;
    }
    if (0 < local_10->mhp) {
      if (local_10->data->mmove == '\0') {
        if (vision_full_recalc != '\0') {
          vision_recalc(0);
        }
        iVar2 = minliquid(local_10);
        if (iVar2 != 0) goto LAB_00244f8a;
      }
      mon_regen(local_10,'\0');
      if (((*(uint *)&local_10->field_0x60 >> 4 & 7) != 0) && (iVar2 = rn2(6), iVar2 == 0)) {
        newcham(level,local_10,(permonst *)0x0,'\0','\0');
      }
      were_change(local_10);
      if ((local_10->mblinded != '\0') &&
         (uVar1 = local_10->mblinded + 0xff, local_10->mblinded = uVar1, uVar1 == '\0')) {
        *(uint *)&local_10->field_0x60 = *(uint *)&local_10->field_0x60 & 0xfffdffff | 0x20000;
      }
      if ((local_10->mfrozen != '\0') &&
         (uVar1 = local_10->mfrozen + 0xff, local_10->mfrozen = uVar1, uVar1 == '\0')) {
        *(uint *)&local_10->field_0x60 = *(uint *)&local_10->field_0x60 & 0xfffbffff | 0x40000;
      }
      if ((local_10->mfleetim != '\0') &&
         (uVar1 = local_10->mfleetim + 0xff, local_10->mfleetim = uVar1, uVar1 == '\0')) {
        *(uint *)&local_10->field_0x60 = *(uint *)&local_10->field_0x60 & 0xfffeffff;
      }
    }
LAB_00244f8a:
    local_10 = local_10->nmon;
  } while( true );
}

Assistant:

void mcalcdistress(void)
{
    struct monst *mtmp;

    for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
	if (DEADMONSTER(mtmp)) continue;

	/* must check non-moving monsters once/turn in case
	 * they managed to end up in liquid */
	if (mtmp->data->mmove == 0) {
	    if (vision_full_recalc) vision_recalc(0);
	    if (minliquid(mtmp)) continue;
	}

	/* regenerate hit points */
	mon_regen(mtmp, FALSE);

	/* possibly polymorph shapechangers and lycanthropes */
	if (mtmp->cham && !rn2(6))
	    newcham(level, mtmp, NULL, FALSE, FALSE);
	were_change(mtmp);

	/* gradually time out temporary problems */
	if (mtmp->mblinded && !--mtmp->mblinded)
	    mtmp->mcansee = 1;
	if (mtmp->mfrozen && !--mtmp->mfrozen)
	    mtmp->mcanmove = 1;
	if (mtmp->mfleetim && !--mtmp->mfleetim)
	    mtmp->mflee = 0;

	/* FIXME: mtmp->mlstmv ought to be updated here */
    }
}